

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int geopolyOverlap(GeoPoly *p1,GeoPoly *p2)

{
  double dVar1;
  GeoSegment *pGVar2;
  int iVar3;
  int iVar4;
  GeoOverlap *p;
  GeoSegment *pGVar5;
  GeoEvent *pGVar6;
  GeoSegment *pGVar7;
  GeoSegment *pGVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  double dVar18;
  GeoSegment *pGVar19;
  undefined4 local_1cc;
  GeoSegment *local_1c8;
  long local_1c0 [49];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar10 = p1->nVertex;
  iVar3 = p2->nVertex;
  iVar4 = sqlite3_initialize();
  iVar11 = -1;
  if (iVar4 != 0) goto LAB_001fc1ee;
  lVar9 = (long)(iVar10 + iVar3 + 2);
  p = (GeoOverlap *)sqlite3Malloc(lVar9 * 0x70 + 0x18);
  if (p == (GeoOverlap *)0x0) goto LAB_001fc1ee;
  p->aEvent = (GeoEvent *)(p + 1);
  p->aSegment = (GeoSegment *)((long)p + lVar9 * 0x40 + 0x18);
  p->nEvent = 0;
  p->nSegment = 0;
  geopolyAddSegments(p,p1,'\x01');
  geopolyAddSegments(p,p2,'\x02');
  lVar9 = (long)p->nEvent;
  if (lVar9 < 1) {
LAB_001fc1db:
    iVar11 = 0;
  }
  else {
    pGVar6 = p->aEvent;
    memset(&local_1c8,0xaa,400);
    lVar12 = 0;
    uVar13 = 0;
    do {
      while( true ) {
        pGVar5 = (GeoSegment *)(pGVar6 + lVar12);
        pGVar6[lVar12].pNext = (GeoEvent *)0x0;
        if ((int)uVar13 < 1) break;
        uVar16 = (ulong)uVar13;
        if (local_1c8 == (GeoSegment *)0x0) {
          bVar17 = true;
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          pGVar19 = local_1c8;
          do {
            pGVar5 = (GeoSegment *)geopolyEventMerge((GeoEvent *)pGVar19,(GeoEvent *)pGVar5);
            local_1c0[uVar15 - 1] = 0;
            if (uVar16 - 1 == uVar15) {
              bVar17 = false;
              uVar14 = uVar13;
              goto LAB_001fbf06;
            }
            pGVar19 = (GeoSegment *)local_1c0[uVar15];
            uVar15 = uVar15 + 1;
          } while (pGVar19 != (GeoSegment *)0x0);
          bVar17 = uVar15 < uVar16;
        }
        uVar16 = uVar15 & 0xffffffff;
        uVar14 = (uint)uVar15;
LAB_001fbf06:
        local_1c0[uVar16 - 1] = (long)pGVar5;
        uVar14 = uVar14 + 1;
        if (bVar17) {
          uVar14 = uVar13;
        }
        uVar13 = uVar14;
        lVar12 = lVar12 + 1;
        if (lVar12 == lVar9) {
          if ((int)uVar13 < 1) goto LAB_001fc1db;
          goto LAB_001fbf29;
        }
      }
      local_1c8 = pGVar5;
      lVar12 = lVar12 + 1;
      uVar13 = 1;
    } while (lVar12 != lVar9);
LAB_001fbf29:
    uVar16 = 0;
    pGVar6 = (GeoEvent *)0x0;
    do {
      pGVar6 = geopolyEventMerge((GeoEvent *)local_1c0[uVar16 - 1],pGVar6);
      uVar16 = uVar16 + 1;
    } while (uVar13 != uVar16);
    if (pGVar6 == (GeoEvent *)0x0) goto LAB_001fc1db;
    dVar18 = (double)(-(ulong)(pGVar6->x == 0.0) & 0xbff0000000000000);
    local_1cc = 0;
    pGVar5 = (GeoSegment *)0x0;
    bVar17 = false;
    do {
      dVar1 = pGVar6->x;
      if ((dVar1 != dVar18) || (NAN(dVar1) || NAN(dVar18))) {
        if (bVar17) {
          if (pGVar5 == (GeoSegment *)0x0) {
LAB_001fc06a:
            pGVar5 = (GeoSegment *)0x0;
          }
          else {
            memset(&local_1c8,0xaa,400);
            uVar16 = 0;
            do {
              while( true ) {
                pGVar19 = pGVar5->pNext;
                pGVar5->pNext = (GeoSegment *)0x0;
                iVar10 = (int)uVar16;
                if (iVar10 < 1) break;
                if (local_1c8 == (GeoSegment *)0x0) {
                  bVar17 = true;
                  uVar15 = 0;
                }
                else {
                  uVar15 = 0;
                  pGVar8 = local_1c8;
                  do {
                    pGVar5 = geopolySegmentMerge(pGVar8,pGVar5);
                    local_1c0[uVar15 - 1] = 0;
                    if (uVar16 - 1 == uVar15) {
                      bVar17 = false;
                      uVar15 = uVar16;
                      goto LAB_001fc02b;
                    }
                    pGVar8 = (GeoSegment *)local_1c0[uVar15];
                    uVar15 = uVar15 + 1;
                  } while (pGVar8 != (GeoSegment *)0x0);
                  bVar17 = uVar15 < uVar16;
                }
                iVar10 = (int)uVar15;
                uVar15 = uVar15 & 0xffffffff;
LAB_001fc02b:
                local_1c0[uVar15 - 1] = (long)pGVar5;
                uVar15 = (ulong)(iVar10 + 1);
                if (bVar17) {
                  uVar15 = uVar16;
                }
                uVar16 = uVar15;
                pGVar5 = pGVar19;
                if (pGVar19 == (GeoSegment *)0x0) {
                  if ((int)uVar15 < 1) goto LAB_001fc06a;
                  goto LAB_001fc048;
                }
              }
              local_1c8 = pGVar5;
              uVar16 = 1;
              pGVar5 = pGVar19;
            } while (pGVar19 != (GeoSegment *)0x0);
LAB_001fc048:
            uVar15 = 0;
            pGVar5 = (GeoSegment *)0x0;
            do {
              pGVar5 = geopolySegmentMerge((GeoSegment *)local_1c0[uVar15 - 1],pGVar5);
              uVar15 = uVar15 + 1;
            } while (uVar16 != uVar15);
          }
        }
        dVar18 = dVar1;
        if (pGVar5 != (GeoSegment *)0x0) {
          uVar16 = 0;
          pGVar19 = pGVar5;
          pGVar8 = (GeoSegment *)0x0;
          do {
            pGVar7 = pGVar19;
            if (pGVar8 != (GeoSegment *)0x0) {
              if (((double)pGVar8->y != (double)pGVar7->y) ||
                 (NAN(pGVar8->y) || NAN((double)pGVar7->y))) {
                *(undefined1 *)((long)&local_1cc + uVar16) = 1;
              }
            }
            uVar16 = (ulong)((uint)uVar16 ^ (uint)pGVar7->side);
            pGVar19 = pGVar7->pNext;
            pGVar8 = pGVar7;
          } while (pGVar7->pNext != (GeoSegment *)0x0);
          bVar17 = false;
          if (pGVar5 != (GeoSegment *)0x0) {
            pGVar19 = pGVar5;
            pGVar8 = (GeoSegment *)0x0;
            do {
              pGVar7 = pGVar19;
              pGVar19 = (GeoSegment *)(pGVar7->C * dVar1 + pGVar7->B);
              pGVar7->y = (double)pGVar19;
              if (pGVar8 != (GeoSegment *)0x0) {
                pGVar2 = (GeoSegment *)pGVar8->y;
                if (((double)pGVar19 < (double)pGVar2) && (pGVar8->side != pGVar7->side)) {
                  iVar11 = 1;
                  goto LAB_001fc1e9;
                }
                if (((double)pGVar2 != (double)pGVar19) ||
                   (NAN((double)pGVar2) || NAN((double)pGVar19))) {
                  *(undefined1 *)((long)&local_1cc + uVar16) = 1;
                }
              }
              uVar16 = (ulong)((uint)uVar16 ^ (uint)pGVar7->side);
              pGVar19 = pGVar7->pNext;
              pGVar8 = pGVar7;
            } while (pGVar7->pNext != (GeoSegment *)0x0);
            goto LAB_001fc121;
          }
        }
        bVar17 = false;
        pGVar5 = (GeoSegment *)0x0;
      }
LAB_001fc121:
      pGVar19 = pGVar6->pSeg;
      if (pGVar6->eType == 0) {
        pGVar19->y = (double)(double)pGVar19->y0;
        pGVar19->pNext = pGVar5;
        bVar17 = true;
        pGVar5 = pGVar19;
      }
      else {
        pGVar8 = pGVar5;
        if (pGVar5 == pGVar19) {
          if (pGVar5 == (GeoSegment *)0x0) {
            pGVar5 = (GeoSegment *)0x0;
          }
          else {
            pGVar5 = pGVar5->pNext;
          }
        }
        else {
          do {
            pGVar7 = pGVar8;
            if (pGVar7 == (GeoSegment *)0x0) goto LAB_001fc182;
            pGVar8 = pGVar7->pNext;
          } while (pGVar8 != pGVar19);
          if (pGVar19 == (GeoSegment *)0x0) {
            pGVar19 = (GeoSegment *)0x0;
          }
          else {
            pGVar19 = pGVar8->pNext;
          }
          pGVar7->pNext = pGVar19;
        }
      }
LAB_001fc182:
      pGVar6 = pGVar6->pNext;
    } while (pGVar6 != (GeoEvent *)0x0);
    if (local_1cc._3_1_ == '\0') {
      iVar11 = 0;
    }
    else {
      iVar11 = 3;
      if ((local_1cc._1_1_ == '\0' || local_1cc._2_1_ != '\0') &&
         (iVar11 = 2, local_1cc._1_1_ != '\0' || local_1cc._2_1_ == '\0')) {
        iVar11 = (uint)(local_1cc._1_1_ == '\0' && local_1cc._2_1_ == '\0') * 3 + 1;
      }
    }
  }
LAB_001fc1e9:
  sqlite3_free(p);
LAB_001fc1ee:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar11;
}

Assistant:

static int geopolyOverlap(GeoPoly *p1, GeoPoly *p2){
  sqlite3_int64 nVertex = p1->nVertex + p2->nVertex + 2;
  GeoOverlap *p;
  sqlite3_int64 nByte;
  GeoEvent *pThisEvent;
  double rX;
  int rc = 0;
  int needSort = 0;
  GeoSegment *pActive = 0;
  GeoSegment *pSeg;
  unsigned char aOverlap[4];

  nByte = sizeof(GeoEvent)*nVertex*2
           + sizeof(GeoSegment)*nVertex
           + sizeof(GeoOverlap);
  p = sqlite3_malloc64( nByte );
  if( p==0 ) return -1;
  p->aEvent = (GeoEvent*)&p[1];
  p->aSegment = (GeoSegment*)&p->aEvent[nVertex*2];
  p->nEvent = p->nSegment = 0;
  geopolyAddSegments(p, p1, 1);
  geopolyAddSegments(p, p2, 2);
  pThisEvent = geopolySortEventsByX(p->aEvent, p->nEvent);
  rX = pThisEvent && pThisEvent->x==0.0 ? -1.0 : 0.0;
  memset(aOverlap, 0, sizeof(aOverlap));
  while( pThisEvent ){
    if( pThisEvent->x!=rX ){
      GeoSegment *pPrev = 0;
      int iMask = 0;
      GEODEBUG(("Distinct X: %g\n", pThisEvent->x));
      rX = pThisEvent->x;
      if( needSort ){
        GEODEBUG(("SORT\n"));
        pActive = geopolySortSegmentsByYAndC(pActive);
        needSort = 0;
      }
      for(pSeg=pActive; pSeg; pSeg=pSeg->pNext){
        if( pPrev ){
          if( pPrev->y!=pSeg->y ){
            GEODEBUG(("MASK: %d\n", iMask));
            aOverlap[iMask] = 1;
          }
        }
        iMask ^= pSeg->side;
        pPrev = pSeg;
      }
      pPrev = 0;
      for(pSeg=pActive; pSeg; pSeg=pSeg->pNext){
        double y = pSeg->C*rX + pSeg->B;
        GEODEBUG(("Segment %d.%d %g->%g\n", pSeg->side, pSeg->idx, pSeg->y, y));
        pSeg->y = y;
        if( pPrev ){
          if( pPrev->y>pSeg->y && pPrev->side!=pSeg->side ){
            rc = 1;
            GEODEBUG(("Crossing: %d.%d and %d.%d\n",
                    pPrev->side, pPrev->idx,
                    pSeg->side, pSeg->idx));
            goto geopolyOverlapDone;
          }else if( pPrev->y!=pSeg->y ){
            GEODEBUG(("MASK: %d\n", iMask));
            aOverlap[iMask] = 1;
          }
        }
        iMask ^= pSeg->side;
        pPrev = pSeg;
      }
    }
    GEODEBUG(("%s %d.%d C=%g B=%g\n",
      pThisEvent->eType ? "RM " : "ADD",
      pThisEvent->pSeg->side, pThisEvent->pSeg->idx,
      pThisEvent->pSeg->C,
      pThisEvent->pSeg->B));
    if( pThisEvent->eType==0 ){
      /* Add a segment */
      pSeg = pThisEvent->pSeg;
      pSeg->y = pSeg->y0;
      pSeg->pNext = pActive;
      pActive = pSeg;
      needSort = 1;
    }else{
      /* Remove a segment */
      if( pActive==pThisEvent->pSeg ){
        pActive = ALWAYS(pActive) ? pActive->pNext : 0;
      }else{
        for(pSeg=pActive; pSeg; pSeg=pSeg->pNext){
          if( pSeg->pNext==pThisEvent->pSeg ){
            pSeg->pNext = ALWAYS(pSeg->pNext) ? pSeg->pNext->pNext : 0;
            break;
          }
        }
      }
    }
    pThisEvent = pThisEvent->pNext;
  }
  if( aOverlap[3]==0 ){
    rc = 0;
  }else if( aOverlap[1]!=0 && aOverlap[2]==0 ){
    rc = 3;
  }else if( aOverlap[1]==0 && aOverlap[2]!=0 ){
    rc = 2;
  }else if( aOverlap[1]==0 && aOverlap[2]==0 ){
    rc = 4;
  }else{
    rc = 1;
  }

geopolyOverlapDone:
  sqlite3_free(p);
  return rc;
}